

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall kj::_::anon_unknown_0::TestCase199::run(TestCase199 *this)

{
  string *__rhs;
  __type _Var1;
  bool bVar2;
  allocator<char> local_321;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  Fault f;
  int i;
  char *str;
  MockExceptionCallback mockCallback;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  MockExceptionCallback::MockExceptionCallback(&mockCallback);
  if (Debug::minSeverity < 2) {
    Debug::log<char_const(&)[13]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xcb,WARNING,"\"Hello world!\"",(char (*) [13])"Hello world!");
  }
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,(allocator<char> *)&str);
  fileLine(&local_320,&local_50,0xcb);
  ::std::operator+(&local_300,"log message: ",&local_320);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &local_300,":+0: warning: Hello world!\n");
  __rhs = &mockCallback.text;
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            __rhs);
  ::std::__cxx11::string::~string((string *)&f);
  ::std::__cxx11::string::~string((string *)&local_300);
  ::std::__cxx11::string::~string((string *)&local_320);
  ::std::__cxx11::string::~string((string *)&local_50);
  if ((!_Var1) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,(allocator<char> *)&str);
    fileLine(&local_320,&local_70,0xcb);
    ::std::operator+(&local_300,"log message: ",&local_320);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                     &local_300,":+0: warning: Hello world!\n");
    Debug::log<char_const(&)[216],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xcd,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: warning: Hello world!\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: warning: Hello world!\\n\", mockCallback.text"
               ,(char (*) [216])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: warning: Hello world!\\n\") == (mockCallback.text)"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,__rhs);
    ::std::__cxx11::string::~string((string *)&f);
    ::std::__cxx11::string::~string((string *)&local_300);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  mockCallback.text._M_string_length = 0;
  *mockCallback.text._M_dataplus._M_p = '\0';
  i = 0x7b;
  str = "foo";
  if (Debug::minSeverity < 3) {
    Debug::log<int&,char_const*&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd3,ERROR,"i, str",&i,&str);
  }
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_321);
  fileLine(&local_320,&local_90,0xd3);
  ::std::operator+(&local_300,"log message: ",&local_320);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &local_300,":+0: error: i = 123; str = foo\n");
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            __rhs);
  ::std::__cxx11::string::~string((string *)&f);
  ::std::__cxx11::string::~string((string *)&local_300);
  ::std::__cxx11::string::~string((string *)&local_320);
  ::std::__cxx11::string::~string((string *)&local_90);
  if ((!_Var1) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,&local_321);
    fileLine(&local_320,&local_b0,0xd3);
    ::std::operator+(&local_300,"log message: ",&local_320);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                     &local_300,":+0: error: i = 123; str = foo\n");
    Debug::log<char_const(&)[220],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd5,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: error: i = 123; str = foo\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: error: i = 123; str = foo\\n\", mockCallback.text"
               ,(char (*) [220])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: error: i = 123; str = foo\\n\") == (mockCallback.text)"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,__rhs);
    ::std::__cxx11::string::~string((string *)&f);
    ::std::__cxx11::string::~string((string *)&local_300);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  mockCallback.text._M_string_length = 0;
  *mockCallback.text._M_dataplus._M_p = '\0';
  if (Debug::minSeverity < 5) {
    Debug::log<char_const(&)[17]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xd8,DBG,"\"Some debug text.\"",(char (*) [17])"Some debug text.");
  }
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_321);
  fileLine(&local_320,&local_d0,0xd8);
  ::std::operator+(&local_300,"log message: ",&local_320);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &local_300,":+0: debug: Some debug text.\n");
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            __rhs);
  ::std::__cxx11::string::~string((string *)&f);
  ::std::__cxx11::string::~string((string *)&local_300);
  ::std::__cxx11::string::~string((string *)&local_320);
  ::std::__cxx11::string::~string((string *)&local_d0);
  if ((!_Var1) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,&local_321);
    fileLine(&local_320,&local_f0,0xd8);
    ::std::operator+(&local_300,"log message: ",&local_320);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                     &local_300,":+0: debug: Some debug text.\n");
    Debug::log<char_const(&)[218],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xda,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: debug: Some debug text.\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: debug: Some debug text.\\n\", mockCallback.text"
               ,(char (*) [218])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: debug: Some debug text.\\n\") == (mockCallback.text)"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,__rhs);
    ::std::__cxx11::string::~string((string *)&f);
    ::std::__cxx11::string::~string((string *)&local_300);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_f0);
  }
  mockCallback.text._M_string_length = 0;
  *mockCallback.text._M_dataplus._M_p = '\0';
  if (Debug::minSeverity < 1) {
    Debug::log<char_const(&)[6]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xde,INFO,"\"Info.\"",(char (*) [6])"Info.");
  }
  bVar2 = ::std::operator==("",__rhs);
  if ((!bVar2) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[45],char_const(&)[1],std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (mockCallback.text)\", \"\", mockCallback.text"
               ,(char (*) [45])"failed: expected (\"\") == (mockCallback.text)",
               (char (*) [1])0x19e242,__rhs);
  }
  mockCallback.text._M_string_length = 0;
  *mockCallback.text._M_dataplus._M_p = '\0';
  Debug::minSeverity = 0;
  Debug::log<char_const(&)[11]>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,0xe4,INFO,"\"Some text.\"",(char (*) [11])"Some text.");
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
             ,&local_321);
  fileLine(&local_320,&local_110,0xe4);
  ::std::operator+(&local_300,"log message: ",&local_320);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                   &local_300,":+0: info: Some text.\n");
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                            __rhs);
  ::std::__cxx11::string::~string((string *)&f);
  ::std::__cxx11::string::~string((string *)&local_300);
  ::std::__cxx11::string::~string((string *)&local_320);
  ::std::__cxx11::string::~string((string *)&local_110);
  if ((!_Var1) && (Debug::minSeverity < 3)) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,&local_321);
    fileLine(&local_320,&local_130,0xe4);
    ::std::operator+(&local_300,"log message: ",&local_320);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                     &local_300,":+0: info: Some text.\n");
    Debug::log<char_const(&)[211],std::__cxx11::string,std::__cxx11::string&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
               ,0xe6,ERROR,
               "\"failed: expected \" \"(\\\"log message: \\\" + fileLine(\\\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\\\", line) + \\\":+0: info: Some text.\\\\n\\\") == (mockCallback.text)\", \"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: info: Some text.\\n\", mockCallback.text"
               ,(char (*) [211])
                "failed: expected (\"log message: \" + fileLine(\"/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++\", line) + \":+0: info: Some text.\\n\") == (mockCallback.text)"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,__rhs);
    ::std::__cxx11::string::~string((string *)&f);
    ::std::__cxx11::string::~string((string *)&local_300);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_130);
  }
  mockCallback.text._M_string_length = 0;
  *mockCallback.text._M_dataplus._M_p = '\0';
  Debug::minSeverity = 1;
  Debug::Fault::Fault(&f,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/debug-test.c++"
                      ,0xed,FAILED,"1 == 2","");
  Debug::Fault::fatal(&f);
}

Assistant:

TEST(Debug, Log) {
  MockExceptionCallback mockCallback;
  int line;

  KJ_LOG(WARNING, "Hello world!"); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: warning: Hello world!\n",
            mockCallback.text);
  mockCallback.text.clear();

  int i = 123;
  const char* str = "foo";

  KJ_LOG(ERROR, i, str); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: error: i = 123; str = foo\n",
            mockCallback.text);
  mockCallback.text.clear();

  KJ_DBG("Some debug text."); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: debug: Some debug text.\n",
            mockCallback.text);
  mockCallback.text.clear();

  // INFO logging is disabled by default.
  KJ_LOG(INFO, "Info."); line = __LINE__;
  EXPECT_EQ("", mockCallback.text);
  mockCallback.text.clear();

  // Enable it.
  Debug::setLogLevel(Debug::Severity::INFO);
  KJ_LOG(INFO, "Some text."); line = __LINE__;
  EXPECT_EQ("log message: " + fileLine(__FILE__, line) + ":+0: info: Some text.\n",
            mockCallback.text);
  mockCallback.text.clear();

  // Back to default.
  Debug::setLogLevel(Debug::Severity::WARNING);

  KJ_ASSERT(1 == 1);
  EXPECT_FATAL(KJ_ASSERT(1 == 2)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2\n", mockCallback.text);
  mockCallback.text.clear();

  KJ_ASSERT(1 == 1) {
    ADD_FAILURE() << "Shouldn't call recovery code when check passes.";
    break;
  };

  bool recovered = false;
  KJ_ASSERT(1 == 2, "1 is not 2") { recovered = true; break; } line = __LINE__;
  EXPECT_EQ("recoverable exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; 1 is not 2\n", mockCallback.text);
  EXPECT_TRUE(recovered);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_ASSERT(1 == 2, i, "hi", str)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; i = 123; hi; str = foo\n", mockCallback.text);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_REQUIRE(1 == 2, i, "hi", str)); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: expected "
            "1 == 2; i = 123; hi; str = foo\n", mockCallback.text);
  mockCallback.text.clear();

  EXPECT_FATAL(KJ_FAIL_ASSERT("foo")); line = __LINE__;
  EXPECT_EQ("fatal exception: " + fileLine(__FILE__, line) + ": failed: foo\n",
            mockCallback.text);
  mockCallback.text.clear();
}